

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

float * drwav_open_memory_and_read_f32
                  (void *data,size_t dataSize,uint *channels,uint *sampleRate,
                  drwav_uint64 *totalSampleCount)

{
  drwav_bool32 dVar1;
  float *pfVar2;
  drwav wav;
  drwav local_1c0;
  
  if (sampleRate != (uint *)0x0) {
    *sampleRate = 0;
  }
  if (channels != (uint *)0x0) {
    *channels = 0;
  }
  if (totalSampleCount != (drwav_uint64 *)0x0) {
    *totalSampleCount = 0;
  }
  pfVar2 = (float *)0x0;
  dVar1 = drwav_init_memory_ex(&local_1c0,data,dataSize,(drwav_chunk_proc)0x0,(void *)0x0,0);
  if (dVar1 != 0) {
    pfVar2 = drwav__read_and_close_f32(&local_1c0,channels,sampleRate,totalSampleCount);
  }
  return pfVar2;
}

Assistant:

float* drwav_open_memory_and_read_f32(const void* data, size_t dataSize, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount)
{
    if (sampleRate) *sampleRate = 0;
    if (channels) *channels = 0;
    if (totalSampleCount) *totalSampleCount = 0;

    drwav wav;
    if (!drwav_init_memory(&wav, data, dataSize)) {
        return NULL;
    }

    return drwav__read_and_close_f32(&wav, channels, sampleRate, totalSampleCount);
}